

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O0

void __thiscall
t_lua_generator::generate_deserialize_field
          (t_lua_generator *this,ostream *out,t_field *tfield,bool local,string *prefix)

{
  t_struct *ptVar1;
  byte bVar2;
  t_field *ptVar3;
  uint uVar4;
  t_type *type_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  string *psVar6;
  ostream *poVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  char *pcVar10;
  undefined1 auVar11 [12];
  string local_f0;
  t_base local_cc;
  undefined1 local_c8 [4];
  t_base tbase;
  string local_a8;
  undefined1 local_88 [8];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  t_struct *local_38;
  t_type *type;
  string *prefix_local;
  t_field *ptStack_20;
  bool local_local;
  t_field *tfield_local;
  ostream *out_local;
  t_lua_generator *this_local;
  
  type = (t_type *)prefix;
  prefix_local._7_1_ = local;
  ptStack_20 = tfield;
  tfield_local = (t_field *)out;
  out_local = (ostream *)this;
  type_00 = t_field::get_type(tfield);
  local_38 = (t_struct *)t_generator::get_true_type(type_00);
  uVar4 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[4])();
  if ((uVar4 & 1) == 0) {
    psVar6 = t_field::get_name_abi_cxx11_(ptStack_20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   prefix,psVar6);
    uVar4 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[0xb])();
    if (((uVar4 & 1) == 0) &&
       (uVar4 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar4 & 1) == 0)) {
      uVar4 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[0xd])();
      ptVar3 = tfield_local;
      bVar2 = prefix_local._7_1_;
      ptVar1 = local_38;
      if ((uVar4 & 1) == 0) {
        uVar4 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[5])();
        if (((uVar4 & 1) == 0) &&
           (uVar4 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[10])(), (uVar4 & 1) == 0)) {
          t_field::get_name_abi_cxx11_(ptStack_20);
          uVar8 = std::__cxx11::string::c_str();
          (*(local_38->super_t_type).super_t_doc._vptr_t_doc[3])();
          uVar9 = std::__cxx11::string::c_str();
          printf("DO NOT KNOW HOW TO DESERIALIZE FIELD \'%s\' TYPE \'%s\'\n",uVar8,uVar9);
        }
        else {
          poVar7 = t_generator::indent((t_generator *)this,(ostream *)tfield_local);
          pcVar10 = "";
          if ((prefix_local._7_1_ & 1) != 0) {
            pcVar10 = "local ";
          }
          poVar7 = std::operator<<(poVar7,pcVar10);
          poVar7 = std::operator<<(poVar7,(string *)local_88);
          std::operator<<(poVar7," = iprot:");
          uVar4 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[5])();
          if ((uVar4 & 1) == 0) {
            uVar4 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[10])();
            if ((uVar4 & 1) != 0) {
              std::operator<<((ostream *)tfield_local,"readI32()");
            }
          }
          else {
            local_cc = t_base_type::get_base((t_base_type *)local_38);
            switch(local_cc) {
            case TYPE_VOID:
              pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __cxa_allocate_exception(0x20);
              std::operator+(pbVar5,"compiler error: cannot serialize void field in a struct: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_88);
              __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            case TYPE_STRING:
              std::operator<<((ostream *)tfield_local,"readString()");
              break;
            case TYPE_BOOL:
              std::operator<<((ostream *)tfield_local,"readBool()");
              break;
            case TYPE_I8:
              std::operator<<((ostream *)tfield_local,"readByte()");
              break;
            case TYPE_I16:
              std::operator<<((ostream *)tfield_local,"readI16()");
              break;
            case TYPE_I32:
              std::operator<<((ostream *)tfield_local,"readI32()");
              break;
            case TYPE_I64:
              std::operator<<((ostream *)tfield_local,"readI64()");
              break;
            case TYPE_DOUBLE:
              std::operator<<((ostream *)tfield_local,"readDouble()");
              break;
            default:
              auVar11 = __cxa_allocate_exception(0x20);
              t_base_type::t_base_name_abi_cxx11_
                        (&local_f0,(t_base_type *)(ulong)local_cc,auVar11._8_4_);
              std::operator+(auVar11._0_8_,"compiler error: no PHP name for base type ",&local_f0);
              __cxa_throw(auVar11._0_8_,&std::__cxx11::string::typeinfo,
                          std::__cxx11::string::~string);
            }
          }
          std::operator<<((ostream *)tfield_local,(string *)&::endl_abi_cxx11_);
        }
      }
      else {
        std::__cxx11::string::string((string *)local_c8,(string *)local_88);
        generate_deserialize_container
                  (this,(ostream *)ptVar3,&ptVar1->super_t_type,(bool)(bVar2 & 1),(string *)local_c8
                  );
        std::__cxx11::string::~string((string *)local_c8);
      }
    }
    else {
      ptVar3 = tfield_local;
      bVar2 = prefix_local._7_1_;
      ptVar1 = local_38;
      std::__cxx11::string::string((string *)&local_a8,(string *)local_88);
      generate_deserialize_struct(this,(ostream *)ptVar3,ptVar1,(bool)(bVar2 & 1),&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    std::__cxx11::string::~string((string *)local_88);
    return;
  }
  name.field_2._M_local_buf[0xb] = '\x01';
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
  std::operator+(&local_58,"CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: ",prefix);
  psVar6 = t_field::get_name_abi_cxx11_(ptStack_20);
  std::operator+(pbVar5,&local_58,psVar6);
  name.field_2._M_local_buf[0xb] = '\0';
  __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void t_lua_generator::generate_deserialize_field(ostream& out,
                                                 t_field* tfield,
                                                 bool local,
                                                 string prefix) {
  t_type* type = get_true_type(tfield->get_type());

  if (type->is_void()) {
    throw "CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
  }

  string name = prefix + tfield->get_name();

  if (type->is_struct() || type->is_xception()) {
    generate_deserialize_struct(out, (t_struct*)type, local, name);
  } else if (type->is_container()) {
    generate_deserialize_container(out, type, local, name);
  } else if (type->is_base_type() || type->is_enum()) {
    indent(out) << (local ? "local " : "") << name << " = iprot:";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        out << "readString()";
        break;
      case t_base_type::TYPE_BOOL:
        out << "readBool()";
        break;
      case t_base_type::TYPE_I8:
        out << "readByte()";
        break;
      case t_base_type::TYPE_I16:
        out << "readI16()";
        break;
      case t_base_type::TYPE_I32:
        out << "readI32()";
        break;
      case t_base_type::TYPE_I64:
        out << "readI64()";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "readDouble()";
        break;
      default:
        throw "compiler error: no PHP name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "readI32()";
    }
    out << endl;

  } else {
    printf("DO NOT KNOW HOW TO DESERIALIZE FIELD '%s' TYPE '%s'\n",
           tfield->get_name().c_str(),
           type->get_name().c_str());
  }
}